

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

void __thiscall IR::Instr::ClearBailOutInfo(Instr *this)

{
  AllocatorType *allocator;
  code *pcVar1;
  bool bVar2;
  BailOutInfo *this_00;
  undefined4 *puVar3;
  JitArenaAllocator *alloc;
  BailOutInfo *bailOutInfo;
  Instr *this_local;
  
  bVar2 = HasBailOutInfo(this);
  if ((bVar2) || (bVar2 = HasAuxBailOut(this), bVar2)) {
    this_00 = GetBailOutInfo(this);
    if (this_00 == (BailOutInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0xd1c,"(bailOutInfo)","bailOutInfo");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    if (this_00->bailOutInstr == this) {
      allocator = this->m_func->m_alloc;
      BailOutInfo::Clear(this_00,allocator);
      Memory::DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BailOutInfo>
                (allocator,this_00);
    }
    this->field_0x38 = this->field_0x38 & 0xef;
    this->field_0x38 = this->field_0x38 & 0xbf;
  }
  return;
}

Assistant:

void
Instr::ClearBailOutInfo()
{
    if (this->HasBailOutInfo() || this->HasAuxBailOut())
    {
        BailOutInfo * bailOutInfo = this->GetBailOutInfo();
        Assert(bailOutInfo);

        if (bailOutInfo->bailOutInstr == this)
        {
            JitArenaAllocator * alloc = this->m_func->m_alloc;
            bailOutInfo->Clear(alloc);
            JitAdelete(alloc, bailOutInfo);
        }

        this->hasBailOutInfo = false;
        this->hasAuxBailOut = false;
    }
}